

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O2

Gia_Man_t *
Gia_ManCheckFalse2(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  uint *__ptr;
  void *pvVar4;
  Gia_Obj_t *pGVar5;
  float *pfVar6;
  Vec_Que_t *p_00;
  int *__s;
  int *__s_00;
  Vec_Wec_t *vHooks;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar13;
  undefined8 extraout_RDX_01;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float **local_78;
  
  Gia_ManLevelNum(p);
  pVVar7 = p->vCos;
  uVar15 = pVVar7->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar10 = uVar15;
  if (uVar15 - 1 < 0xf) {
    uVar10 = 0x10;
  }
  __ptr[1] = 0;
  *__ptr = uVar10;
  iVar14 = 0;
  if (uVar10 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar10 << 2);
  }
  local_78 = (float **)(__ptr + 2);
  *(void **)(__ptr + 2) = pvVar4;
  for (; iVar14 < (int)uVar15; iVar14 = iVar14 + 1) {
    pGVar5 = Gia_ManCo(p,iVar14);
    if (pGVar5 == (Gia_Obj_t *)0x0) {
      pVVar7 = p->vCos;
      uVar15 = pVVar7->nSize;
      break;
    }
    iVar2 = Gia_ObjLevel(p,pGVar5);
    uVar15 = __ptr[1];
    if (uVar15 == *__ptr) {
      uVar10 = uVar15 * 2;
      if ((int)uVar15 < 0x10) {
        uVar10 = 0x10;
      }
      pfVar6 = *local_78;
      if ((int)uVar15 < (int)uVar10) {
        if (pfVar6 == (float *)0x0) {
          pfVar6 = (float *)malloc((ulong)uVar10 << 2);
        }
        else {
          pfVar6 = (float *)realloc(pfVar6,(ulong)uVar10 << 2);
          uVar15 = __ptr[1];
        }
        *(float **)(__ptr + 2) = pfVar6;
        *__ptr = uVar10;
      }
    }
    else {
      pfVar6 = *local_78;
    }
    __ptr[1] = uVar15 + 1;
    pfVar6[(int)uVar15] = (float)iVar2;
    pVVar7 = p->vCos;
    uVar15 = pVVar7->nSize;
  }
  p_00 = (Vec_Que_t *)calloc(1,0x20);
  uVar18 = 0x10;
  if (0x10 < (int)uVar15) {
    uVar18 = (ulong)uVar15;
  }
  p_00->nSize = 1;
  iVar14 = (int)uVar18 + 1;
  p_00->nCap = iVar14;
  __size = uVar18 * 4 + 4;
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  p_00->pHeap = __s;
  __s_00 = (int *)malloc(__size);
  memset(__s_00,0xff,__size);
  p_00->pOrder = __s_00;
  p_00->pCostsFlt = local_78;
  uVar15 = 1;
  for (uVar18 = 0; (long)uVar18 < (long)pVVar7->nSize; uVar18 = uVar18 + 1) {
    iVar2 = (int)uVar18;
    pGVar5 = Gia_ManCo(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if (iVar14 <= (int)uVar15) {
      iVar3 = uVar15 + 1;
      iVar11 = iVar14 * 2;
      if (iVar3 != iVar11 && SBORROW4(iVar3,iVar11) == iVar3 + iVar14 * -2 < 0) {
        iVar11 = iVar3;
      }
      Vec_QueGrow(p_00,iVar11);
      iVar14 = p_00->nCap;
    }
    if ((long)iVar14 <= (long)uVar18) {
      iVar11 = iVar14 * 2;
      iVar3 = iVar2 + 1;
      if (iVar3 != iVar11 && SBORROW4(iVar3,iVar11) == iVar3 + iVar14 * -2 < 0) {
        iVar11 = iVar3;
      }
      Vec_QueGrow(p_00,iVar11);
      iVar14 = p_00->nCap;
    }
    iVar11 = p_00->nSize;
    if (iVar14 <= iVar11) {
      __assert_fail("p->nSize < p->nCap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    __s_00 = p_00->pOrder;
    if (__s_00[uVar18] != -1) {
      __assert_fail("p->pOrder[v] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    __s = p_00->pHeap;
    if (__s[iVar11] != -1) {
      __assert_fail("p->pHeap[p->nSize] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    __s_00[uVar18] = iVar11;
    uVar15 = iVar11 + 1;
    p_00->nSize = uVar15;
    __s[iVar11] = iVar2;
    local_78 = p_00->pCostsFlt;
    pfVar6 = *local_78;
    if (pfVar6 == (float *)0x0) {
      fVar19 = (float)iVar2;
    }
    else {
      fVar19 = pfVar6[uVar18];
    }
    uVar12 = (ulong)__s_00[uVar18];
    if (uVar12 == 0xffffffffffffffff) {
      __assert_fail("p->pOrder[v] != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
    }
    if (uVar18 != (uint)__s[uVar12]) {
      __assert_fail("p->pHeap[i] == v",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
    }
    while (iVar11 = (int)uVar12, 1 < iVar11) {
      iVar3 = __s[(uint)(iVar11 >> 1)];
      if (pfVar6 == (float *)0x0) {
        fVar20 = (float)iVar3;
      }
      else {
        fVar20 = pfVar6[iVar3];
      }
      if (fVar19 <= fVar20) break;
      __s[uVar12 & 0xffffffff] = iVar3;
      __s_00[iVar3] = iVar11;
      uVar12 = (ulong)(uint)(iVar11 >> 1);
    }
    __s[iVar11] = iVar2;
    __s_00[uVar18] = iVar11;
    pVVar7 = p->vCos;
  }
  uVar10 = p->nObjs;
  vHooks = (Vec_Wec_t *)malloc(0x10);
  uVar18 = 8;
  if (6 < uVar10 - 1) {
    uVar18 = (ulong)uVar10;
  }
  iVar14 = (int)uVar18;
  vHooks->nCap = iVar14;
  if (iVar14 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
    uVar13 = extraout_RDX;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)iVar14,0x10);
    uVar13 = extraout_RDX_00;
  }
  vHooks->pArray = pVVar7;
  vHooks->nSize = uVar10;
  uVar12 = (ulong)uVar15;
  do {
    iVar2 = (int)uVar13;
    if ((int)uVar12 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x88,"int Vec_QueSize(Vec_Que_t *)");
    }
    fVar19 = -1e+09;
    if (uVar12 != 1) {
      if (*local_78 == (float *)0x0) {
        fVar19 = (float)__s[1];
      }
      else {
        fVar19 = (*local_78)[__s[1]];
      }
    }
    if (fVar19 < (float)(p->nLevels - nSlackMax)) {
      if (fVerbose != 0) {
        uVar15 = 0;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        uVar17 = 0;
        for (; uVar10 != uVar15; uVar15 = uVar15 + 1) {
          pVVar8 = Vec_WecEntry(vHooks,uVar15);
          uVar17 = uVar17 + (0 < pVVar8->nSize);
        }
        printf("Collected %d non-overlapping false paths.\n",(ulong)uVar17);
        iVar2 = extraout_EDX;
      }
      pGVar9 = Gia_ManFalseRebuild(p,vHooks,iVar2,fVeryVerbose);
      uVar12 = 0;
      if (iVar14 < 1) {
        uVar18 = uVar12;
      }
      for (; uVar18 * 0x10 != uVar12; uVar12 = uVar12 + 0x10) {
        pvVar4 = *(void **)((long)&pVVar7->pArray + uVar12);
        if (pvVar4 != (void *)0x0) {
          free(pvVar4);
          *(undefined8 *)((long)&pVVar7->pArray + uVar12) = 0;
        }
      }
      free(pVVar7);
      free(vHooks);
      free(*(void **)(__ptr + 2));
      free(__ptr);
      free(__s_00);
      free(__s);
      free(p_00);
      return pGVar9;
    }
    if (uVar12 == 1) {
      __assert_fail("p->nSize > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0xed,"int Vec_QuePop(Vec_Que_t *)");
    }
    iVar2 = __s[1];
    __s_00[iVar2] = -1;
    uVar12 = uVar12 - 1;
    iVar11 = (int)uVar12;
    if (iVar11 == 1) {
      __s[1] = -1;
    }
    else {
      iVar3 = __s[uVar12 & 0xffffffff];
      __s[uVar12 & 0xffffffff] = -1;
      __s[1] = iVar3;
      __s_00[iVar3] = 1;
      pfVar6 = *local_78;
      if (pfVar6 == (float *)0x0) {
        fVar19 = (float)iVar3;
      }
      else {
        fVar19 = pfVar6[iVar3];
      }
      uVar15 = 1;
      while( true ) {
        uVar17 = uVar15 * 2;
        if (iVar11 <= (int)uVar17) break;
        uVar16 = uVar17 | 1;
        if ((int)uVar16 < iVar11) {
          if (pfVar6 == (float *)0x0) {
            fVar20 = (float)__s[(int)uVar17];
            fVar21 = (float)__s[(int)uVar16];
          }
          else {
            fVar20 = pfVar6[__s[(int)uVar17]];
            fVar21 = pfVar6[__s[(int)uVar16]];
          }
          if (fVar20 < fVar21) {
            uVar17 = uVar16;
          }
        }
        if (iVar11 <= (int)uVar17) {
          __assert_fail("child < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
        }
        iVar1 = __s[(int)uVar17];
        if (pfVar6 == (float *)0x0) {
          fVar20 = (float)iVar1;
        }
        else {
          fVar20 = pfVar6[iVar1];
        }
        if (fVar20 <= fVar19) break;
        __s[(int)uVar15] = iVar1;
        __s_00[iVar1] = uVar15;
        uVar15 = uVar17;
      }
      __s[(int)uVar15] = iVar3;
      __s_00[iVar3] = uVar15;
    }
    Gia_ManCheckFalseOne(p,iVar2,nTimeOut,vHooks,fVerbose,fVeryVerbose);
    uVar13 = extraout_RDX_01;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManCheckFalse2( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew;
    Vec_Wec_t * vHooks;
    Vec_Que_t * vPrio;
    Vec_Flt_t * vWeights;
    Gia_Obj_t * pObj;
    int i;
//    srand( 111 );
    Gia_ManLevelNum( p );
    // create PO weights
    vWeights = Vec_FltAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_FltPush( vWeights, Gia_ObjLevel(p, pObj) );
    // put POs into the queue
    vPrio = Vec_QueAlloc( Gia_ManCoNum(p) );
    Vec_QueSetPriority( vPrio, Vec_FltArrayP(vWeights) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_QuePush( vPrio, i );
    // work on each PO in the queue
    vHooks = Vec_WecStart( Gia_ManObjNum(p) );
    while ( Vec_QueTopPriority(vPrio) >= p->nLevels - nSlackMax )
        Gia_ManCheckFalseOne( p, Vec_QuePop(vPrio), nTimeOut, vHooks, fVerbose, fVeryVerbose );
    if ( fVerbose )
    printf( "Collected %d non-overlapping false paths.\n", Vec_WecSizeUsed(vHooks) );
    // reconstruct the AIG
    pNew = Gia_ManFalseRebuild( p, vHooks, fVerbose, fVeryVerbose );
    // cleanup
    Vec_WecFree( vHooks );
    Vec_FltFree( vWeights );
    Vec_QueFree( vPrio );
    return pNew;
}